

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Strash(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Vec_Int_t *pVVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Gia_Man_t *pGVar7;
  Gia_Man_t *pGVar8;
  char *pcVar9;
  char *pcVar10;
  uint local_44;
  uint local_40;
  uint local_3c;
  
  local_3c = 0;
  Extra_UtilGetoptReset();
  local_40 = 2;
  bVar4 = false;
  local_44 = 0;
  bVar3 = false;
  bVar2 = false;
LAB_0024899c:
  do {
    while (iVar5 = Extra_UtilGetopt(argc,argv,"Lacmrsh"), iVar6 = globalUtilOptind, iVar5 == 0x72) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    if (iVar5 == -1) {
      pGVar7 = pAbc->pGia;
      if (pGVar7 != (Gia_Man_t *)0x0) {
        pVVar1 = pGVar7->vMapping;
        if (bVar3) {
          if (pVVar1 != (Vec_Int_t *)0x0) {
            Abc_Print(0,"Restructing the current AIG destroys the LUT mapping.\n");
            pGVar7 = pAbc->pGia;
          }
          Vec_IntFreeP(&pGVar7->vMapping);
          pGVar7 = Gia_ManDupMuxRestructure(pAbc->pGia);
          Abc_Print(1,
                    "Finished AIG restructing to enable efficient mapping of 4:1 MUXes into 4-LUTs.\n"
                   );
LAB_00248c3e:
          if (bVar4) goto LAB_00248c42;
          pGVar8 = pAbc->pGia;
        }
        else {
          if ((pVVar1 != (Vec_Int_t *)0x0) && (bVar2)) {
            pGVar7 = Gia_ManDupHashMapping(pGVar7);
            Gia_ManTransferPacking(pGVar7,pAbc->pGia);
            Gia_ManTransferTiming(pGVar7,pAbc->pGia);
            goto LAB_00248c3e;
          }
          if (pVVar1 != (Vec_Int_t *)0x0) {
            if (pGVar7->vConfigs == (Vec_Int_t *)0x0) {
              pGVar7 = (Gia_Man_t *)Dsm_ManDeriveGia(pGVar7,local_44);
            }
            else {
              pGVar7 = (Gia_Man_t *)If_ManDeriveGiaFromCells(pGVar7);
            }
            goto LAB_00248c3e;
          }
          if (local_44 != 0) {
            if (pGVar7->pMuxes != (uint *)0x0) {
              pcVar9 = "Abc_CommandAbc9Strash(): The AIG already has MUXes.\n";
              goto LAB_00248ab3;
            }
            pGVar7 = Gia_ManDupMuxes(pGVar7,local_40);
            pcVar9 = Abc_FrameReadFlag("silentmode");
            if (pcVar9 == (char *)0x0) {
              pcVar9 = "Generated AND/XOR/MUX graph.";
LAB_00248db6:
              puts(pcVar9);
            }
            goto LAB_00248c3e;
          }
          if ((!bVar4) || (pGVar7->pAigExtra == (Gia_Man_t *)0x0)) {
            if (pGVar7->pMuxes == (uint *)0x0) {
              pGVar7 = Gia_ManRehash(pGVar7,local_3c);
            }
            else {
              pGVar7 = Gia_ManDupNoMuxes(pGVar7,0);
              pcVar9 = Abc_FrameReadFlag("silentmode");
              if (pcVar9 == (char *)0x0) {
                pcVar9 = "Generated AIG from AND/XOR/MUX graph.";
                goto LAB_00248db6;
              }
            }
            goto LAB_00248c3e;
          }
          if (pGVar7->nBufs != 0) {
            __assert_fail("!Gia_ManBufNum(pAbc->pGia)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abc.c"
                          ,0x7d61,"int Abc_CommandAbc9Strash(Abc_Frame_t *, int, char **)");
          }
          iVar6 = Gia_ManIsSeqWithBoxes(pGVar7);
          if ((iVar6 == 0) && (iVar6 = Gia_ManRegBoxNum(pAbc->pGia), iVar6 == 0)) {
            pGVar7 = Gia_ManDupCollapse(pAbc->pGia,pAbc->pGia->pAigExtra,(Vec_Int_t *)0x0,0);
          }
          else {
            pGVar8 = Gia_ManDupUnshuffleInputs(pAbc->pGia);
            Gia_ManTransferTiming(pGVar8,pAbc->pGia);
            pGVar7 = pGVar8->pAigExtra;
            iVar6 = Gia_ManRegBoxNum(pGVar8);
            pGVar7 = Gia_ManDupCollapse(pGVar8,pGVar7,(Vec_Int_t *)0x0,(uint)(0 < iVar6));
            Gia_ManTransferTiming(pAbc->pGia,pGVar8);
            Gia_ManStop(pGVar8);
          }
          pcVar9 = Abc_FrameReadFlag("silentmode");
          if (pcVar9 == (char *)0x0) {
            puts("Collapsed AIG with boxes and logic of the boxes.");
          }
LAB_00248c42:
          pGVar8 = pAbc->pGia;
          if (pGVar8->pAigExtra != (Gia_Man_t *)0x0) goto LAB_00248c85;
        }
        Gia_ManTransferTiming(pGVar7,pGVar8);
        pGVar8 = pAbc->pGia;
        pcVar9 = pGVar7->pCellStr;
        pGVar8->vConfigs = pGVar7->vConfigs;
        pGVar8->pCellStr = pcVar9;
        pGVar7->vConfigs = (Vec_Int_t *)0x0;
        pGVar7->pCellStr = (char *)0x0;
LAB_00248c85:
        Abc_FrameUpdateGia(pAbc,pGVar7);
        return 0;
      }
      pcVar9 = "Abc_CommandAbc9Strash(): There is no AIG.\n";
LAB_00248ab3:
      iVar6 = -1;
      goto LAB_00248c26;
    }
    if (iVar5 != 0x73) {
      if (iVar5 == 0x61) {
        local_3c = local_3c ^ 1;
      }
      else if (iVar5 == 99) {
        bVar4 = (bool)(bVar4 ^ 1);
      }
      else if (iVar5 == 0x6d) {
        local_44 = local_44 ^ 1;
      }
      else {
        if (iVar5 != 0x4c) goto LAB_00248b41;
        if (argc <= globalUtilOptind) {
          Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
          goto LAB_00248b41;
        }
        local_40 = atoi(argv[globalUtilOptind]);
        globalUtilOptind = iVar6 + 1;
        if ((int)local_40 < 0) {
LAB_00248b41:
          iVar6 = -2;
          Abc_Print(-2,"usage: &st [-L num] [-acmrsh]\n");
          Abc_Print(-2,"\t         performs structural hashing\n");
          pcVar10 = "yes";
          pcVar9 = "yes";
          if (local_3c == 0) {
            pcVar9 = "no";
          }
          Abc_Print(-2,"\t-a     : toggle additional hashing [default = %s]\n",pcVar9);
          pcVar9 = "yes";
          if (!bVar4) {
            pcVar9 = "no";
          }
          Abc_Print(-2,"\t-c     : toggle collapsing hierarchical AIG [default = %s]\n",pcVar9);
          pcVar9 = "yes";
          if (local_44 == 0) {
            pcVar9 = "no";
          }
          Abc_Print(-2,"\t-m     : toggle converting to larger gates [default = %s]\n",pcVar9);
          Abc_Print(-2,
                    "\t-L num : create MUX when sum of refs does not exceed this limit [default = %d]\n"
                    ,(ulong)local_40);
          Abc_Print(-2,"\t         (use L = 1 to create AIG with XORs but without MUXes)\n");
          pcVar9 = "yes";
          if (!bVar2) {
            pcVar9 = "no";
          }
          Abc_Print(-2,"\t-r     : toggle rehashing AIG while preserving mapping [default = %s]\n",
                    pcVar9);
          if (!bVar3) {
            pcVar10 = "no";
          }
          Abc_Print(-2,"\t-s     : toggle using MUX restructuring [default = %s]\n",pcVar10);
          pcVar9 = "\t-h     : print the command usage\n";
LAB_00248c26:
          Abc_Print(iVar6,pcVar9);
          return 1;
        }
      }
      goto LAB_0024899c;
    }
    bVar3 = (bool)(bVar3 ^ 1);
  } while( true );
}

Assistant:

int Abc_CommandAbc9Strash( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManDupMuxRestructure( Gia_Man_t * p );
    Gia_Man_t * pTemp;
    int c, Limit = 2;
    int fAddStrash = 0;
    int fCollapse = 0;
    int fAddMuxes = 0;
    int fStrMuxes = 0;
    int fRehashMap = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Lacmrsh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            Limit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Limit < 0 )
                goto usage;
            break;
        case 'a':
            fAddStrash ^= 1;
            break;
        case 'c':
            fCollapse ^= 1;
            break;
        case 'm':
            fAddMuxes ^= 1;
            break;
        case 'r':
            fRehashMap ^= 1;
            break;
        case 's':
            fStrMuxes ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Strash(): There is no AIG.\n" );
        return 1;
    }
    if ( fStrMuxes )
    {
        if ( Gia_ManHasMapping(pAbc->pGia) )
            Abc_Print( 0, "Restructing the current AIG destroys the LUT mapping.\n" );
        Vec_IntFreeP( &pAbc->pGia->vMapping );
        pTemp = Gia_ManDupMuxRestructure( pAbc->pGia );
        Abc_Print( 1, "Finished AIG restructing to enable efficient mapping of 4:1 MUXes into 4-LUTs.\n" );
    }
    else if ( Gia_ManHasMapping(pAbc->pGia) && fRehashMap )
    {
        pTemp = Gia_ManDupHashMapping( pAbc->pGia );
        Gia_ManTransferPacking( pTemp, pAbc->pGia );
        Gia_ManTransferTiming( pTemp, pAbc->pGia );
    }
    else if ( Gia_ManHasMapping(pAbc->pGia) && pAbc->pGia->vConfigs )
        pTemp = (Gia_Man_t *)If_ManDeriveGiaFromCells( pAbc->pGia );
    else if ( Gia_ManHasMapping(pAbc->pGia) )
        pTemp = (Gia_Man_t *)Dsm_ManDeriveGia( pAbc->pGia, fAddMuxes ); // delay-oriented unmapping
    else if ( fAddMuxes )
    {
        if ( pAbc->pGia->pMuxes )
        {
            Abc_Print( -1, "Abc_CommandAbc9Strash(): The AIG already has MUXes.\n" );
            return 1;
        }
        pTemp = Gia_ManDupMuxes( pAbc->pGia, Limit );
        if ( !Abc_FrameReadFlag("silentmode") )
            printf( "Generated AND/XOR/MUX graph.\n" );
    }
    else if ( fCollapse && pAbc->pGia->pAigExtra )
    {
        assert( !Gia_ManBufNum(pAbc->pGia) );
        if ( Gia_ManIsSeqWithBoxes(pAbc->pGia) || Gia_ManRegBoxNum(pAbc->pGia) )
        {
            Gia_Man_t * pUnshuffled = Gia_ManDupUnshuffleInputs( pAbc->pGia );
            Gia_ManTransferTiming( pUnshuffled, pAbc->pGia );
            pTemp = Gia_ManDupCollapse( pUnshuffled, pUnshuffled->pAigExtra, NULL, Gia_ManRegBoxNum(pUnshuffled) > 0 );
            Gia_ManTransferTiming( pAbc->pGia, pUnshuffled );
            Gia_ManStop( pUnshuffled );
        }
        else
            pTemp = Gia_ManDupCollapse( pAbc->pGia, pAbc->pGia->pAigExtra, NULL, 0 );
        if ( !Abc_FrameReadFlag("silentmode") )
            printf( "Collapsed AIG with boxes and logic of the boxes.\n" );
    }
    else if ( pAbc->pGia->pMuxes )
    {
        pTemp = Gia_ManDupNoMuxes( pAbc->pGia, 0 );
        if ( !Abc_FrameReadFlag("silentmode") )
            printf( "Generated AIG from AND/XOR/MUX graph.\n" );
    }
    else
    {
        pTemp = Gia_ManRehash( pAbc->pGia, fAddStrash );
//        if ( !Abc_FrameReadFlag("silentmode") )
//            printf( "Rehashed the current AIG.\n" );
    }
    if ( !(fCollapse && pAbc->pGia->pAigExtra) )
    {
        Gia_ManTransferTiming( pTemp, pAbc->pGia );
        pAbc->pGia->vConfigs = pTemp->vConfigs;     pTemp->vConfigs = NULL;
        pAbc->pGia->pCellStr = pTemp->pCellStr;     pTemp->pCellStr = NULL;
    }
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &st [-L num] [-acmrsh]\n" );
    Abc_Print( -2, "\t         performs structural hashing\n" );
    Abc_Print( -2, "\t-a     : toggle additional hashing [default = %s]\n", fAddStrash? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle collapsing hierarchical AIG [default = %s]\n", fCollapse? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle converting to larger gates [default = %s]\n", fAddMuxes? "yes": "no" );
    Abc_Print( -2, "\t-L num : create MUX when sum of refs does not exceed this limit [default = %d]\n", Limit );
    Abc_Print( -2, "\t         (use L = 1 to create AIG with XORs but without MUXes)\n" );
    Abc_Print( -2, "\t-r     : toggle rehashing AIG while preserving mapping [default = %s]\n", fRehashMap? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle using MUX restructuring [default = %s]\n", fStrMuxes? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}